

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spmd.h
# Opt level: O0

time_t __thiscall bsplib::Spmd::time(Spmd *this,time_t *__timer)

{
  undefined1 local_20 [8];
  timespec now;
  Spmd *this_local;
  
  now.tv_nsec = (__syscall_slong_t)this;
  clock_gettime(1,(timespec *)local_20);
  return now.tv_sec - (this->m_time).tv_nsec;
}

Assistant:

double time() const { 
      struct timespec now;
      clock_gettime( CLOCK_MONOTONIC, &now );
      return (now.tv_sec - m_time.tv_sec) 
               + 1e-9 * (now.tv_nsec - m_time.tv_nsec );
    }